

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_in_out.cpp
# Opt level: O1

void ThrottlingSum::Register(Connection *con)

{
  TableFunction TVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  type pCVar2;
  ClientContext *pCVar3;
  initializer_list<duckdb::LogicalType> __l;
  __alloc_node_gen_t __alloc_node_gen;
  CreateTableFunctionInfo caching_table_in_out_info;
  TableFunction caching_table_in_out;
  code *pcVar4;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
  this_00;
  _Vector_impl_data in_stack_fffffffffffffa78;
  undefined1 *puVar5;
  undefined1 in_stack_fffffffffffffa98 [24];
  undefined **ppuVar6;
  undefined1 in_stack_fffffffffffffab8 [136];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 in_stack_fffffffffffffb78 [168];
  undefined **local_398 [37];
  undefined1 *local_270;
  undefined1 local_260 [16];
  undefined1 *local_250;
  undefined1 local_240 [16];
  vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_> local_230 [24];
  undefined1 *local_218;
  undefined1 local_208 [16];
  vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_> local_1f8 [24];
  undefined1 local_1e0 [200];
  undefined1 auStack_118 [48];
  code *local_e8;
  code *local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  duckdb::Connection::BeginTransaction();
  pCVar2 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*
                     ((shared_ptr<duckdb::ClientContext,_true> *)con);
  pCVar3 = (ClientContext *)duckdb::Catalog::GetSystemCatalog(pCVar2);
  puVar5 = &stack0xfffffffffffffaa0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffa90,"throttling_sum","");
  duckdb::LogicalType::LogicalType((LogicalType *)local_398,TABLE);
  __l._M_len = 1;
  __l._M_array = (iterator)local_398;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &stack0xfffffffffffffa78,__l,(allocator_type *)&stack0xfffffffffffffa70);
  pcVar4 = ThrottlingSumLocalInit;
  duckdb::TableFunction::TableFunction
            ((TableFunction *)local_1e0,&stack0xfffffffffffffa90,&stack0xfffffffffffffa78,0,Bind,
             ThrottlingSumGlobalInit);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &stack0xfffffffffffffa78);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_398);
  if (puVar5 != &stack0xfffffffffffffaa0) {
    operator_delete(puVar5);
  }
  local_e8 = Function;
  local_e0 = Finalize;
  duckdb::SimpleFunction::SimpleFunction
            ((SimpleFunction *)&stack0xfffffffffffffab0,(SimpleFunction *)local_1e0);
  this_00._M_h = (__hashtable_alloc *)&stack0xfffffffffffffb40;
  uVar7 = 0;
  uVar8 = 0;
  uVar9 = 0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this_00._M_h,
             (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)(local_1e0 + 0x90),
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
              *)&stack0xfffffffffffffa70);
  ppuVar6 = &PTR__TableFunction_005da400;
  memcpy(&stack0xfffffffffffffb78,auStack_118,0xd6);
  this._M_pi = local_38._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  TVar1._8_8_ = this_00._M_h;
  TVar1._0_8_ = pcVar4;
  TVar1._16_8_ = in_stack_fffffffffffffa78._M_start;
  TVar1._24_8_ = in_stack_fffffffffffffa78._M_finish;
  TVar1._32_8_ = in_stack_fffffffffffffa78._M_end_of_storage;
  TVar1._40_8_ = puVar5;
  TVar1._48_24_ = in_stack_fffffffffffffa98;
  TVar1._72_8_ = ppuVar6;
  TVar1._80_136_ = in_stack_fffffffffffffab8;
  TVar1.bind_operator = (table_function_bind_operator_t)uVar7;
  TVar1.init_global = (table_function_init_global_t)local_1e0._152_8_;
  TVar1.init_local = (table_function_init_local_t)uVar8;
  TVar1.function = (table_function_t)local_1e0._168_8_;
  TVar1.in_out_function = (table_in_out_function_t)local_1e0._176_8_;
  TVar1.in_out_function_final = (table_in_out_function_final_t)local_1e0._184_8_;
  TVar1.statistics = (table_statistics_t)uVar9;
  TVar1.dependency = (table_function_dependency_t)in_stack_fffffffffffffb78._0_8_;
  TVar1.cardinality = (table_function_cardinality_t)in_stack_fffffffffffffb78._8_8_;
  TVar1.pushdown_complex_filter =
       (table_function_pushdown_complex_filter_t)in_stack_fffffffffffffb78._16_8_;
  TVar1.pushdown_expression = (table_function_pushdown_expression_t)in_stack_fffffffffffffb78._24_8_
  ;
  TVar1.to_string = (table_function_to_string_t)in_stack_fffffffffffffb78._32_8_;
  TVar1.dynamic_to_string = (table_function_dynamic_to_string_t)in_stack_fffffffffffffb78._40_8_;
  TVar1.table_scan_progress = (table_function_progress_t)in_stack_fffffffffffffb78._48_8_;
  TVar1.get_partition_data = (table_function_get_partition_data_t)in_stack_fffffffffffffb78._56_8_;
  TVar1.get_bind_info = (table_function_get_bind_info_t)in_stack_fffffffffffffb78._64_8_;
  TVar1.type_pushdown = (table_function_type_pushdown_t)in_stack_fffffffffffffb78._72_8_;
  TVar1.get_multi_file_reader =
       (table_function_get_multi_file_reader_t)in_stack_fffffffffffffb78._80_8_;
  TVar1.supports_pushdown_type =
       (table_function_supports_pushdown_type_t)in_stack_fffffffffffffb78._88_8_;
  TVar1.get_partition_info = (table_function_get_partition_info_t)in_stack_fffffffffffffb78._96_8_;
  TVar1.get_partition_stats =
       (table_function_get_partition_stats_t)in_stack_fffffffffffffb78._104_8_;
  TVar1.get_virtual_columns =
       (table_function_get_virtual_columns_t)in_stack_fffffffffffffb78._112_8_;
  TVar1.serialize = (table_function_serialize_t)in_stack_fffffffffffffb78._120_8_;
  TVar1.deserialize = (table_function_deserialize_t)in_stack_fffffffffffffb78._128_8_;
  TVar1.verify_serialization = (bool)in_stack_fffffffffffffb78[0x88];
  TVar1.projection_pushdown = (bool)in_stack_fffffffffffffb78[0x89];
  TVar1.filter_pushdown = (bool)in_stack_fffffffffffffb78[0x8a];
  TVar1.filter_prune = (bool)in_stack_fffffffffffffb78[0x8b];
  TVar1.sampling_pushdown = (bool)in_stack_fffffffffffffb78[0x8c];
  TVar1.late_materialization = (bool)in_stack_fffffffffffffb78[0x8d];
  TVar1._414_2_ = in_stack_fffffffffffffb78._142_2_;
  TVar1.function_info.internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2> =
       (original)(original)in_stack_fffffffffffffb78._144_16_;
  TVar1.global_initialization = in_stack_fffffffffffffb78._160_4_;
  TVar1._436_4_ = in_stack_fffffffffffffb78._164_4_;
  duckdb::CreateTableFunctionInfo::CreateTableFunctionInfo
            ((CreateTableFunctionInfo *)local_398,TVar1);
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this._M_pi);
  }
  duckdb::SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)&stack0xfffffffffffffab0);
  pCVar2 = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator*
                     ((shared_ptr<duckdb::ClientContext,_true> *)con);
  duckdb::Catalog::CreateTableFunction(pCVar3,(CreateTableFunctionInfo *)pCVar2);
  duckdb::Connection::Commit();
  local_398[0] = (undefined **)duckdb::MD5Context::MD5Update;
  std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector(local_1f8);
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  local_398[0] = &PTR__CreateFunctionInfo_005db6a0;
  std::vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>::~vector
            (local_230);
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  duckdb::CreateInfo::~CreateInfo((CreateInfo *)local_398);
  local_1e0._0_8_ = &PTR__TableFunction_005da400;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_pi);
  }
  duckdb::SimpleNamedParameterFunction::~SimpleNamedParameterFunction
            ((SimpleNamedParameterFunction *)local_1e0);
  return;
}

Assistant:

static void Register(Connection &con) {
		// Create our test TableFunction
		con.BeginTransaction();
		auto &client_context = *con.context;
		auto &catalog = Catalog::GetSystemCatalog(client_context);
		TableFunction caching_table_in_out("throttling_sum", {LogicalType::TABLE}, nullptr, ThrottlingSum::Bind,
		                                   ThrottlingSum::ThrottlingSumGlobalInit,
		                                   ThrottlingSum::ThrottlingSumLocalInit);
		caching_table_in_out.in_out_function = ThrottlingSum::Function;
		caching_table_in_out.in_out_function_final = ThrottlingSum::Finalize;
		CreateTableFunctionInfo caching_table_in_out_info(caching_table_in_out);
		catalog.CreateTableFunction(*con.context, caching_table_in_out_info);
		con.Commit();
	}